

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::JavaGeneratorTest::JavaGeneratorTest
          (JavaGeneratorTest *this)

{
  Descriptor *pDVar1;
  FileDescriptor *pFVar2;
  string local_128;
  string_view local_108;
  string_view local_f8;
  string local_e8;
  string_view local_c8;
  string_view local_b8;
  allocator<char> local_a1;
  string local_a0;
  unique_ptr<google::protobuf::compiler::java::JavaGenerator,_std::default_delete<google::protobuf::compiler::java::JavaGenerator>_>
  local_80;
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  local_78;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  JavaGeneratorTest *local_10;
  JavaGeneratorTest *this_local;
  
  local_10 = this;
  CommandLineInterfaceTester::CommandLineInterfaceTester(&this->super_CommandLineInterfaceTester);
  (this->super_CommandLineInterfaceTester).super_Test._vptr_Test =
       (_func_int **)&PTR__JavaGeneratorTest_02a082c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"--java_out",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"--java_opt",&local_69);
  std::make_unique<google::protobuf::compiler::java::JavaGenerator>();
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
  ::
  unique_ptr<google::protobuf::compiler::java::JavaGenerator,std::default_delete<google::protobuf::compiler::java::JavaGenerator>,void>
            ((unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
              *)&local_78,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Java test generator",&local_a1);
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_30,&local_68,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  ::~unique_ptr(&local_78);
  std::
  unique_ptr<google::protobuf::compiler::java::JavaGenerator,_std::default_delete<google::protobuf::compiler::java::JavaGenerator>_>
  ::~unique_ptr(&local_80);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b8,"google/protobuf/descriptor.proto");
  pDVar1 = DescriptorProto::descriptor();
  pFVar2 = Descriptor::file(pDVar1);
  FileDescriptor::DebugString_abi_cxx11_(&local_e8,pFVar2);
  local_c8 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e8);
  CommandLineInterfaceTester::CreateTempFile
            (&this->super_CommandLineInterfaceTester,local_b8,local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f8,"third_party/java/protobuf/java_features.proto");
  pDVar1 = pb::JavaFeatures::descriptor();
  pFVar2 = Descriptor::file(pDVar1);
  FileDescriptor::DebugString_abi_cxx11_(&local_128,pFVar2);
  local_108 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_128);
  CommandLineInterfaceTester::CreateTempFile
            (&this->super_CommandLineInterfaceTester,local_f8,local_108);
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

JavaGeneratorTest() {
    RegisterGenerator("--java_out", "--java_opt",
                      std::make_unique<JavaGenerator>(), "Java test generator");

    // Generate built-in protos.
    CreateTempFile(
        "google/protobuf/descriptor.proto",
        google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
    CreateTempFile("third_party/java/protobuf/java_features.proto",
                   pb::JavaFeatures::descriptor()->file()->DebugString());
  }